

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
* __thiscall
chaiscript::detail::Dispatch_Engine::get_functions_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
           *__return_storage_ptr__,Dispatch_Engine *this)

{
  pointer ppVar1;
  element_type *peVar2;
  pointer psVar3;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *internal_func;
  pointer __args_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  *function;
  pointer __args;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar1 = (this->m_state).m_functions.data.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->m_state).m_functions.data.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != ppVar1; __args = __args + 1) {
    peVar2 = (__args->second).
             super___shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    psVar3 = (peVar2->
             super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__args_1 = (peVar2->
                    super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; __args_1 != psVar3;
        __args_1 = __args_1 + 1) {
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
      ::
      emplace_back<std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&>
                ((vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
                  *)__return_storage_ptr__,&__args->first,__args_1);
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, Proxy_Function>> get_functions() const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        std::vector<std::pair<std::string, Proxy_Function>> rets;

        const auto &functions = get_functions_int();

        for (const auto &function : functions) {
          for (const auto &internal_func : *function.second) {
            rets.emplace_back(function.first, internal_func);
          }
        }

        return rets;
      }